

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void string64_suite::test_one(void)

{
  value_type input [10];
  decoder decoder;
  undefined4 local_84;
  long *local_80 [2];
  long local_70 [2];
  uchar local_60 [16];
  decoder local_50;
  
  local_50.input._M_str = local_60;
  local_60[8] = '\0';
  local_60[9] = 'A';
  local_60[0] = 0xd9;
  local_60[1] = '\x01';
  local_60[2] = '\0';
  local_60[3] = '\0';
  local_60[4] = '\0';
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  local_50.input._M_len = 10;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_80[0] = (long *)CONCAT44(local_80[0]._4_4_,local_50.current.code);
  local_84 = 0xd9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::string64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x4e9,"void string64_suite::test_one()",local_80,&local_84);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)local_80,local_50.current.view._M_str,
             local_50.current.view._M_str + local_50.current.view._M_len);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("decoder.value<token::string>()","\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x4ea,"void string64_suite::test_one()",(string *)local_80,"A");
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_80[0] = (long *)CONCAT44(local_80[0]._4_4_,local_50.current.code);
  local_84 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x4ec,"void string64_suite::test_one()",local_80,&local_84);
  return;
}

Assistant:

void test_one()
{
    const value_type input[] = { token::code::string64, 0x01, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x41 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::string>(), "A");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}